

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_octal_integer_abi_cxx11_
          (result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  const_iterator rollback;
  long lVar1;
  value_type *pvVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  detail *ctx;
  pair<long,_toml::detail::region> *this_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_372;
  allocator<char> local_371;
  string str;
  undefined1 local_350 [32];
  integer retval;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  undefined1 local_2b0 [8];
  region local_2a8;
  result<toml::detail::region,_toml::detail::none_t> token;
  undefined1 local_210 [112];
  istringstream iss;
  undefined7 uStack_19f;
  uint auStack_188 [2];
  byte abStack_180 [352];
  
  rollback._M_current = *(char **)(this + 0x40);
  ctx = this;
  sequence<toml::detail::sequence<toml::detail::character<'0'>,_toml::detail::character<'o'>_>,_toml::detail::sequence<toml::detail::in_range<'0',_'7'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'7'>,_toml::detail::sequence<toml::detail::character<'_'>,_toml::detail::in_range<'0',_'7'>_>_>,_toml::detail::unlimited>_>_>
  ::invoke(&token,(location *)this);
  if (token.is_ok_ == true) {
    pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
    region::str_abi_cxx11_(&str,pvVar2);
    iss = (istringstream)0x5f;
    _Var3 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)&iss);
    std::__cxx11::string::erase(&str,_Var3._M_current,str._M_dataplus._M_p + str._M_string_length);
    std::__cxx11::string::erase(&str,str._M_dataplus._M_p);
    std::__cxx11::string::erase(&str,str._M_dataplus._M_p);
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&str,_S_in);
    retval = 0;
    lVar1 = *(long *)(CONCAT71(uStack_19f,iss) + -0x18);
    *(uint *)((long)auStack_188 + lVar1) = *(uint *)((long)auStack_188 + lVar1) & 0xffffffb5 | 0x40;
    std::istream::_M_extract<long>((long *)&iss);
    if ((abStack_180[*(long *)(CONCAT71(uStack_19f,iss) + -0x18)] & 5) == 0) {
      pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
      local_2b0 = (undefined1  [8])retval;
      region::region(&local_2a8,pvVar2);
      this_00 = (pair<long,_toml::detail::region> *)local_210;
      std::pair<long,_toml::detail::region>::pair
                (this_00,(pair<long,_toml::detail::region> *)local_2b0);
      result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,(success_type *)this_00);
      region::~region((region *)(local_210 + 8));
      region::~region(&local_2a8);
    }
    else {
      location::reset((location *)this,rollback);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,"toml::parse_octal_integer:",&local_371);
      source_location::source_location((source_location *)local_2b0,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[13],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_210,(source_location *)local_2b0,(char (*) [13])"out of range");
      __l._M_len = 1;
      __l._M_array = (iterator)local_210;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_300,__l,&local_372);
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_328,&local_2e8,&local_300,&local_2c8,false);
      local_350._0_8_ = local_350 + 0x10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._0_8_ == &local_318) {
        local_350._24_8_ = local_318._8_8_;
      }
      else {
        local_350._0_8_ = local_328._0_8_;
      }
      local_350._8_8_ = local_328._8_8_;
      local_328._8_8_ = (pointer)0x0;
      local_318._M_allocated_capacity = local_318._M_allocated_capacity & 0xffffffffffffff00;
      this_00 = (pair<long,_toml::detail::region> *)local_350;
      local_328._0_8_ = &local_318;
      result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,(failure_type *)local_350);
      std::__cxx11::string::~string((string *)local_350);
      std::__cxx11::string::~string((string *)local_328);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c8);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_300);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_210);
      source_location::~source_location((source_location *)local_2b0);
      std::__cxx11::string::~string((string *)&local_2e8);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    std::__cxx11::string::~string((string *)&str);
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&token,(EVP_PKEY_CTX *)this_00);
  }
  else {
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&token,(EVP_PKEY_CTX *)ctx);
    location::reset((location *)this,rollback);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,"toml::parse_octal_integer:",(allocator<char> *)&local_2e8);
    source_location::source_location((source_location *)local_210,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[33],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&iss,(source_location *)local_210,
               (char (*) [33])"the next token is not an integer");
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&iss;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_350,__l_00,(allocator_type *)&local_300);
    local_328._0_8_ = (pointer)0x0;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_allocated_capacity = 0;
    format_underline((string *)local_2b0,&str,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_350,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_328,false);
    token._0_8_ = (long)&token.field_1 + 8;
    if (local_2b0 == (undefined1  [8])&local_2a8.source_) {
      token.field_1.succ.value.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           local_2a8.source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
    else {
      token._0_8_ = local_2b0;
    }
    token.field_1.succ.value.super_region_base._vptr_region_base =
         (region_base)(region_base)local_2a8.super_region_base._vptr_region_base;
    local_2a8.super_region_base._vptr_region_base = (_func_int **)0x0;
    local_2a8.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_1_ = '\0';
    local_2b0 = (undefined1  [8])&local_2a8.source_;
    result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(failure_type *)&token);
    std::__cxx11::string::~string((string *)&token);
    std::__cxx11::string::~string((string *)local_2b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_328);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_350);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&iss);
    source_location::~source_location((source_location *)local_210);
    std::__cxx11::string::~string((string *)&str);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<integer, region>, std::string>
parse_octal_integer(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_oct_int::invoke(loc))
    {
        auto str = token.unwrap().str();
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());
        str.erase(str.begin()); str.erase(str.begin()); // remove `0o` prefix

        std::istringstream iss(str);
        integer retval(0);
        iss >> std::oct >> retval;
        if(iss.fail())
        {
            // `istream` sets `failbit` if internally-called `std::num_get::get`
            // fails.
            // `std::num_get::get` calls `std::strtoll` if the argument type is
            // signed.
            // `std::strtoll` fails if
            //  - the value is out_of_range or
            //  - no conversion is possible.
            // since we already checked that the string is valid octal integer,
            // so the error reason is out_of_range.
            loc.reset(first);
            return err(format_underline("toml::parse_octal_integer:",
                       {{source_location(loc), "out of range"}}));
        }
        return ok(std::make_pair(retval, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("toml::parse_octal_integer:",
               {{source_location(loc), "the next token is not an integer"}}));
}